

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<unsigned_int>
          (ParserRefImpl<Catch::clara::detail::Opt> *this,uint *ref,string *hint)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  (this->super_ComposableParserImpl<Catch::clara::detail::Opt>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_009b7e18;
  this->m_optionality = Optional;
  ::std::make_shared<Catch::clara::detail::BoundValueRef<unsigned_int>,unsigned_int&>
            ((uint *)&local_28);
  _Var1._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_ref).super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_28;
  (this->m_ref).super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var1._M_pi;
  local_28 = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  ::std::__cxx11::string::string((string *)&this->m_hint,(string *)hint);
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  (this->m_description)._M_string_length = 0;
  (this->m_description).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

ParserRefImpl( T &ref, std::string const &hint )
        :   m_ref( std::make_shared<BoundValueRef<T>>( ref ) ),
            m_hint( hint )
        {}